

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  vfloat<4> vVar8;
  int iVar9;
  BVH *bvh;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [12];
  undefined8 uVar23;
  undefined8 uVar24;
  bool bVar25;
  uint uVar26;
  undefined4 uVar27;
  int iVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  long lVar30;
  long lVar31;
  size_t sVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar39;
  ulong uVar40;
  GridSOA *pGVar41;
  long lVar42;
  GridSOA *pGVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  GridSOA *pGVar47;
  Primitive_conflict3 *prim;
  NodeRef root;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  vint4 ai;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  vint4 ai_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  vint4 ai_3;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  vint4 ai_2;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  vint4 bi_1;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  vint4 bi_3;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  vint4 bi_2;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar191;
  float fVar195;
  float fVar196;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar197;
  undefined1 auVar194 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar205 [16];
  float fVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [64];
  undefined1 local_1cd8 [8];
  float fStack_1cd0;
  undefined4 uStack_1ccc;
  undefined1 local_1cc8 [16];
  undefined1 local_1ca8 [16];
  undefined1 local_1c78 [16];
  RTCFilterFunctionNArguments args;
  GridSOA *local_1c20;
  undefined1 local_1c18 [8];
  float fStack_1c10;
  float fStack_1c0c;
  float local_1c08;
  float fStack_1c04;
  float fStack_1c00;
  undefined1 local_1bb8 [16];
  NodeRef *local_1ba8;
  RayK<4> *local_1ba0;
  GridSOA *local_1b98;
  long local_1b90;
  GridSOA *local_1b88;
  GridSOA *local_1b80;
  GridSOA *local_1b78;
  GridSOA *local_1b70;
  GridSOA *local_1b68;
  GridSOA *local_1b60;
  vbool<4> terminated;
  Precalculations pre;
  GridSOA *local_1b10;
  GridSOA *local_1b08;
  GridSOA *local_1b00;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1a78;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined1 local_1a38 [16];
  undefined1 local_1a28 [16];
  undefined1 local_1a18 [16];
  uint local_1a08;
  uint uStack_1a04;
  uint uStack_1a00;
  uint uStack_19fc;
  uint uStack_19f8;
  uint uStack_19f4;
  uint uStack_19f0;
  uint uStack_19ec;
  undefined1 local_19e8 [16];
  undefined1 local_19d8 [8];
  float fStack_19d0;
  float fStack_19cc;
  vint<4> vitime;
  uint local_1988;
  uint uStack_1984;
  uint uStack_1980;
  uint uStack_197c;
  uint local_1968;
  uint uStack_1964;
  uint uStack_1960;
  uint uStack_195c;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  undefined1 local_1918 [16];
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined1 local_1898 [8];
  float fStack_1890;
  float fStack_188c;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 uStack_1820;
  TravRayK<4,_false> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 extraout_var_02 [56];
  
  uVar24 = mm_lookupmask_ps._8_8_;
  uVar23 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar116 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar72 = vpcmpeqd_avx(auVar116,(undefined1  [16])valid_i->field_0);
    auVar60 = ZEXT816(0) << 0x40;
    auVar12 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar60,5);
    auVar71 = auVar72 & auVar12;
    if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar71[0xf] < '\0')
    {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      auVar12 = vandps_avx(auVar12,auVar72);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar200._8_4_ = 0x7fffffff;
      auVar200._0_8_ = 0x7fffffff7fffffff;
      auVar200._12_4_ = 0x7fffffff;
      auVar72 = vandps_avx(auVar200,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar198._8_4_ = 0x219392ef;
      auVar198._0_8_ = 0x219392ef219392ef;
      auVar198._12_4_ = 0x219392ef;
      auVar72 = vcmpps_avx(auVar72,auVar198,1);
      auVar71 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar198,auVar72)
      ;
      auVar72 = vandps_avx(auVar200,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar72 = vcmpps_avx(auVar72,auVar198,1);
      auVar129 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar198,auVar72
                              );
      auVar72 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar200);
      auVar72 = vcmpps_avx(auVar72,auVar198,1);
      auVar72 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar198,auVar72)
      ;
      auVar61 = vrcpps_avx(auVar71);
      auVar173._8_4_ = 0x3f800000;
      auVar173._0_8_ = 0x3f8000003f800000;
      auVar173._12_4_ = 0x3f800000;
      auVar71 = vfnmadd213ps_fma(auVar71,auVar61,auVar173);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar71,auVar61,auVar61)
      ;
      auVar71 = vrcpps_avx(auVar129);
      auVar129 = vfnmadd213ps_fma(auVar129,auVar71,auVar173);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar129,auVar71,auVar71);
      auVar71 = vrcpps_avx(auVar72);
      auVar72 = vfnmadd213ps_fma(auVar72,auVar71,auVar173);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar72,auVar71,auVar71)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar60,1);
      auVar71._8_4_ = 0x10;
      auVar71._0_8_ = 0x1000000010;
      auVar71._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar72,auVar71);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar60,5);
      auVar129._8_4_ = 0x20;
      auVar129._0_8_ = 0x2000000020;
      auVar129._12_4_ = 0x20;
      auVar147._8_4_ = 0x30;
      auVar147._0_8_ = 0x3000000030;
      auVar147._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar147,auVar129,auVar72);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar60,5);
      auVar61._8_4_ = 0x40;
      auVar61._0_8_ = 0x4000000040;
      auVar61._12_4_ = 0x40;
      auVar98._8_4_ = 0x50;
      auVar98._0_8_ = 0x5000000050;
      auVar98._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar98,auVar61,auVar72);
      auVar72 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar60);
      auVar71 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar214 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar72,auVar12);
      auVar96 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar72,auVar71,auVar12);
      terminated.field_0.i[1] = auVar12._4_4_ ^ auVar116._4_4_;
      terminated.field_0.i[0] = auVar12._0_4_ ^ auVar116._0_4_;
      terminated.field_0.i[2] = auVar12._8_4_ ^ auVar116._8_4_;
      terminated.field_0.i[3] = auVar12._12_4_ ^ auVar116._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 3;
      }
      else {
        uVar35 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1ba0 = ray + 0x80;
      local_1ba8 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar39 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_015595d8:
      do {
        do {
          root.ptr = local_1ba8[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0155b21c;
          local_1ba8 = local_1ba8 + -1;
          paVar39 = paVar39 + -1;
          vVar8.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar39->v;
          auVar210 = ZEXT1664((undefined1  [16])vVar8.field_0);
          auVar116 = vcmpps_avx((undefined1  [16])vVar8.field_0,(undefined1  [16])tray.tfar.field_0,
                                1);
          uVar26 = vmovmskps_avx(auVar116);
        } while (uVar26 == 0);
        uVar29 = (ulong)(uVar26 & 0xff);
        uVar26 = POPCOUNT(uVar26 & 0xff);
        if (uVar35 < uVar26) {
LAB_0155961c:
          do {
            lVar36 = -0x10;
            uVar26 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0155b21c;
              auVar116 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar210._0_16_,6);
              if ((((auVar116 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar116 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar116 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar116[0xf] < '\0') {
                if ((uVar26 & 0xf) == 8) {
                  auVar69 = vpcmpeqd_avx(auVar116,auVar116);
                  auVar69 = auVar69 ^ (undefined1  [16])terminated.field_0;
                  fVar48 = (float)(*(int *)(pre.super_Precalculations.grid + 8) - 1);
                  auVar73._0_4_ = fVar48 * *(float *)(ray + 0x70);
                  auVar73._4_4_ = fVar48 * *(float *)(ray + 0x74);
                  auVar73._8_4_ = fVar48 * *(float *)(ray + 0x78);
                  auVar73._12_4_ = fVar48 * *(float *)(ray + 0x7c);
                  auVar116 = vroundps_avx(auVar73,1);
                  fVar48 = fVar48 + -1.0;
                  auVar49._4_4_ = fVar48;
                  auVar49._0_4_ = fVar48;
                  auVar49._8_4_ = fVar48;
                  auVar49._12_4_ = fVar48;
                  auVar116 = vminps_avx(auVar116,auVar49);
                  auVar116 = vmaxps_avx(auVar116,_DAT_01f45a50);
                  _local_19d8 = vsubps_avx(auVar73,auVar116);
                  vitime.field_0 =
                       (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar116);
                  auVar50._8_4_ = 0x3f800000;
                  auVar50._0_8_ = 0x3f8000003f800000;
                  auVar50._12_4_ = 0x3f800000;
                  local_19e8 = vsubps_avx(auVar50,_local_19d8);
                  uVar29 = root.ptr >> 2 & 0xfffffffffffffffc;
                  auVar94 = auVar69;
                  while (uVar26 = vmovmskps_avx(auVar94), uVar26 != 0) {
                    uVar16 = 0;
                    for (uVar26 = uVar26 & 0xff; (uVar26 & 1) == 0;
                        uVar26 = uVar26 >> 1 | 0x80000000) {
                      uVar16 = uVar16 + 1;
                    }
                    iVar28 = vitime.field_0.i[uVar16];
                    uVar45 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                    uVar40 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc);
                    uVar33 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                    lVar44 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x28) * (long)iVar28;
                    iVar9 = *(int *)(pre.super_Precalculations.grid + 0x10);
                    uVar37 = (ulong)(*(uint *)(pre.super_Precalculations.grid + 0x28) & 0xfffffffc);
                    lVar46 = uVar37 + uVar33 + lVar44;
                    lVar42 = uVar45 * 0xc + lVar46;
                    local_1b98 = pre.super_Precalculations.grid + lVar42 + uVar40 * 4 + uVar29;
                    lVar34 = lVar44 + uVar45 * 8 + uVar33;
                    lVar38 = uVar37 + lVar34;
                    local_1b60 = pre.super_Precalculations.grid + lVar38 + uVar40 * 4 + uVar29;
                    lVar36 = lVar46 + uVar45 * 4;
                    local_1b68 = pre.super_Precalculations.grid + uVar40 * 4 + lVar36 + uVar29;
                    local_1b70 = pre.super_Precalculations.grid + lVar46 + uVar40 * 4 + uVar29;
                    lVar31 = uVar29 + 0x30;
                    local_1b78 = pre.super_Precalculations.grid +
                                 uVar33 + lVar44 + uVar40 * 4 + lVar31;
                    local_1b80 = pre.super_Precalculations.grid + lVar34 + uVar40 * 4 + lVar31;
                    lVar30 = lVar44 + uVar45 * 4 + uVar33;
                    local_1b88 = pre.super_Precalculations.grid + lVar30 + uVar40 * 4 + lVar31;
                    local_1c20 = pre.super_Precalculations.grid + lVar42 + lVar31;
                    pGVar41 = pre.super_Precalculations.grid + lVar38 + lVar31;
                    local_1b08 = pre.super_Precalculations.grid + lVar36 + lVar31;
                    pGVar47 = pre.super_Precalculations.grid + lVar46 + lVar31;
                    local_1b00 = pre.super_Precalculations.grid + lVar34 + lVar31;
                    local_1b10 = pre.super_Precalculations.grid + lVar30 + lVar31;
                    pGVar43 = pre.super_Precalculations.grid + lVar44;
                    auVar51._4_4_ = iVar28;
                    auVar51._0_4_ = iVar28;
                    auVar51._8_4_ = iVar28;
                    auVar51._12_4_ = iVar28;
                    auVar72 = vpcmpeqd_avx(auVar51,(undefined1  [16])vitime.field_0);
                    auVar116 = vpand_avx(auVar72,auVar94);
                    auVar72 = vpcmpeqd_avx(auVar72,auVar72);
                    lVar36 = uVar40 * 4;
                    local_1b90 = uVar33 + 0x2c;
                    auVar96 = ZEXT1664(auVar116);
                    lVar31 = 0;
                    while (lVar31 != (ulong)(iVar9 != 2) + 1) {
                      lVar31 = lVar31 + 1;
                      lVar30 = local_1b90 + uVar29;
                      lVar34 = 0;
                      do {
                        if ((ulong)(uVar40 != 2) * 4 + 4 == lVar34) break;
                        uVar27 = *(undefined4 *)(pGVar43 + lVar34 + lVar30);
                        auVar165._4_4_ = uVar27;
                        auVar165._0_4_ = uVar27;
                        auVar165._8_4_ = uVar27;
                        auVar165._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(local_1b10 + lVar34 + -4);
                        auVar175._4_4_ = uVar27;
                        auVar175._0_4_ = uVar27;
                        auVar175._8_4_ = uVar27;
                        auVar175._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(local_1b00 + lVar34 + -4);
                        auVar183._4_4_ = uVar27;
                        auVar183._0_4_ = uVar27;
                        auVar183._8_4_ = uVar27;
                        auVar183._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(pGVar43 + lVar34 + lVar30 + 4);
                        auVar188._4_4_ = uVar27;
                        auVar188._0_4_ = uVar27;
                        auVar188._8_4_ = uVar27;
                        auVar188._12_4_ = uVar27;
                        local_1ca8._4_4_ = *(undefined4 *)(local_1b10 + lVar34);
                        local_1ca8._0_4_ = local_1ca8._4_4_;
                        local_1ca8._8_4_ = local_1ca8._4_4_;
                        local_1ca8._12_4_ = local_1ca8._4_4_;
                        local_1cc8._4_4_ = *(undefined4 *)(local_1b00 + lVar34);
                        local_1cc8._0_4_ = local_1cc8._4_4_;
                        local_1cc8._8_4_ = local_1cc8._4_4_;
                        local_1cc8._12_4_ = local_1cc8._4_4_;
                        auVar98 = auVar96._0_16_;
                        uVar27 = *(undefined4 *)(local_1b78 + lVar34 + -4);
                        auVar99._4_4_ = uVar27;
                        auVar99._0_4_ = uVar27;
                        auVar99._8_4_ = uVar27;
                        auVar99._12_4_ = uVar27;
                        local_1cd8._4_4_ = *(undefined4 *)(local_1b88 + lVar34 + -4);
                        local_1cd8._0_4_ = local_1cd8._4_4_;
                        fStack_1cd0 = (float)local_1cd8._4_4_;
                        uStack_1ccc = local_1cd8._4_4_;
                        local_1c78._4_4_ = *(undefined4 *)(local_1b80 + lVar34 + -4);
                        local_1c78._0_4_ = local_1c78._4_4_;
                        local_1c78._8_4_ = local_1c78._4_4_;
                        local_1c78._12_4_ = local_1c78._4_4_;
                        fVar48 = *(float *)(pGVar47 + lVar34 + -4);
                        fVar1 = *(float *)(local_1b08 + lVar34 + -4);
                        fVar2 = *(float *)(pGVar41 + lVar34 + -4);
                        fVar3 = *(float *)(pGVar47 + lVar34);
                        fVar4 = *(float *)(local_1b08 + lVar34);
                        fVar5 = *(float *)(pGVar41 + lVar34);
                        fVar6 = *(float *)(local_1b70 + lVar34 + 0x2c);
                        auVar120._0_4_ = (float)local_19d8._0_4_ * fVar48;
                        auVar120._4_4_ = (float)local_19d8._4_4_ * fVar48;
                        auVar120._8_4_ = fStack_19d0 * fVar48;
                        auVar120._12_4_ = fStack_19cc * fVar48;
                        auVar61 = vfmadd231ps_fma(auVar120,local_19e8,auVar165);
                        fVar48 = *(float *)(local_1b68 + lVar34 + 0x2c);
                        auVar192._0_4_ = (float)local_19d8._0_4_ * fVar1;
                        auVar192._4_4_ = (float)local_19d8._4_4_ * fVar1;
                        auVar192._8_4_ = fStack_19d0 * fVar1;
                        auVar192._12_4_ = fStack_19cc * fVar1;
                        auVar147 = vfmadd231ps_fma(auVar192,local_19e8,auVar175);
                        fVar1 = *(float *)(local_1b60 + lVar34 + 0x2c);
                        auVar74._0_4_ = (float)local_19d8._0_4_ * fVar2;
                        auVar74._4_4_ = (float)local_19d8._4_4_ * fVar2;
                        auVar74._8_4_ = fStack_19d0 * fVar2;
                        auVar74._12_4_ = fStack_19cc * fVar2;
                        auVar97 = vfmadd231ps_fma(auVar74,local_19e8,auVar183);
                        auVar134._0_4_ = (float)local_19d8._0_4_ * fVar3;
                        auVar134._4_4_ = (float)local_19d8._4_4_ * fVar3;
                        auVar134._8_4_ = fStack_19d0 * fVar3;
                        auVar134._12_4_ = fStack_19cc * fVar3;
                        auVar150._0_4_ = (float)local_19d8._0_4_ * fVar4;
                        auVar150._4_4_ = (float)local_19d8._4_4_ * fVar4;
                        auVar150._8_4_ = fStack_19d0 * fVar4;
                        auVar150._12_4_ = fStack_19cc * fVar4;
                        auVar201._0_4_ = (float)local_19d8._0_4_ * fVar5;
                        auVar201._4_4_ = (float)local_19d8._4_4_ * fVar5;
                        auVar201._8_4_ = fStack_19d0 * fVar5;
                        auVar201._12_4_ = fStack_19cc * fVar5;
                        auVar163 = vfmadd231ps_fma(auVar134,local_19e8,auVar188);
                        auVar164 = vfmadd231ps_fma(auVar150,local_19e8,local_1ca8);
                        auVar174 = vfmadd231ps_fma(auVar201,local_19e8,local_1cc8);
                        auVar211._0_4_ = (float)local_19d8._0_4_ * fVar6;
                        auVar211._4_4_ = (float)local_19d8._4_4_ * fVar6;
                        auVar211._8_4_ = fStack_19d0 * fVar6;
                        auVar211._12_4_ = fStack_19cc * fVar6;
                        auVar166._0_4_ = (float)local_19d8._0_4_ * fVar48;
                        auVar166._4_4_ = (float)local_19d8._4_4_ * fVar48;
                        auVar166._8_4_ = fStack_19d0 * fVar48;
                        auVar166._12_4_ = fStack_19cc * fVar48;
                        auVar176._0_4_ = (float)local_19d8._0_4_ * fVar1;
                        auVar176._4_4_ = (float)local_19d8._4_4_ * fVar1;
                        auVar176._8_4_ = fStack_19d0 * fVar1;
                        auVar176._12_4_ = fStack_19cc * fVar1;
                        auVar182 = vfmadd231ps_fma(auVar211,local_19e8,auVar99);
                        auVar119 = vfmadd231ps_fma(auVar166,local_19e8,_local_1cd8);
                        auVar133 = vfmadd231ps_fma(auVar176,local_19e8,local_1c78);
                        auVar71 = *(undefined1 (*) [16])ray;
                        auVar60 = *(undefined1 (*) [16])(ray + 0x10);
                        auVar129 = *(undefined1 (*) [16])(ray + 0x20);
                        auVar198 = vsubps_avx(auVar61,auVar71);
                        auVar173 = vsubps_avx(auVar147,auVar60);
                        auVar97 = vsubps_avx(auVar97,auVar129);
                        auVar117 = vsubps_avx(auVar119,auVar60);
                        auVar14 = vsubps_avx(auVar133,auVar129);
                        auVar15 = vsubps_avx(auVar117,auVar173);
                        auVar118 = vsubps_avx(auVar14,auVar97);
                        auVar52._0_4_ = auVar117._0_4_ + auVar173._0_4_;
                        auVar52._4_4_ = auVar117._4_4_ + auVar173._4_4_;
                        auVar52._8_4_ = auVar117._8_4_ + auVar173._8_4_;
                        auVar52._12_4_ = auVar117._12_4_ + auVar173._12_4_;
                        fVar48 = auVar97._0_4_;
                        auVar121._0_4_ = auVar14._0_4_ + fVar48;
                        fVar1 = auVar97._4_4_;
                        auVar121._4_4_ = auVar14._4_4_ + fVar1;
                        fVar2 = auVar97._8_4_;
                        auVar121._8_4_ = auVar14._8_4_ + fVar2;
                        fVar3 = auVar97._12_4_;
                        auVar121._12_4_ = auVar14._12_4_ + fVar3;
                        auVar205._0_4_ = auVar52._0_4_ * auVar118._0_4_;
                        auVar205._4_4_ = auVar52._4_4_ * auVar118._4_4_;
                        auVar205._8_4_ = auVar52._8_4_ * auVar118._8_4_;
                        auVar205._12_4_ = auVar52._12_4_ * auVar118._12_4_;
                        auVar149 = vfmsub231ps_fma(auVar205,auVar15,auVar121);
                        auVar131 = vsubps_avx(auVar182,auVar71);
                        auVar132 = vsubps_avx(auVar131,auVar198);
                        auVar193._0_4_ = auVar121._0_4_ * auVar132._0_4_;
                        auVar193._4_4_ = auVar121._4_4_ * auVar132._4_4_;
                        auVar193._8_4_ = auVar121._8_4_ * auVar132._8_4_;
                        auVar193._12_4_ = auVar121._12_4_ * auVar132._12_4_;
                        auVar122._0_4_ = auVar131._0_4_ + auVar198._0_4_;
                        auVar122._4_4_ = auVar131._4_4_ + auVar198._4_4_;
                        auVar122._8_4_ = auVar131._8_4_ + auVar198._8_4_;
                        auVar122._12_4_ = auVar131._12_4_ + auVar198._12_4_;
                        auVar147 = vfmsub231ps_fma(auVar193,auVar118,auVar122);
                        auVar123._0_4_ = auVar122._0_4_ * auVar15._0_4_;
                        auVar123._4_4_ = auVar122._4_4_ * auVar15._4_4_;
                        auVar123._8_4_ = auVar122._8_4_ * auVar15._8_4_;
                        auVar123._12_4_ = auVar122._12_4_ * auVar15._12_4_;
                        auVar61 = vfmsub231ps_fma(auVar123,auVar132,auVar52);
                        fVar17 = *(float *)(ray + 0x60);
                        fVar18 = *(float *)(ray + 100);
                        fVar19 = *(float *)(ray + 0x68);
                        auVar22 = *(undefined1 (*) [12])(ray + 0x60);
                        fVar20 = *(float *)(ray + 0x6c);
                        auVar124._0_4_ = fVar17 * auVar61._0_4_;
                        auVar124._4_4_ = fVar18 * auVar61._4_4_;
                        auVar124._8_4_ = fVar19 * auVar61._8_4_;
                        auVar124._12_4_ = fVar20 * auVar61._12_4_;
                        auVar61 = *(undefined1 (*) [16])(ray + 0x50);
                        auVar148 = vfmadd231ps_fma(auVar124,auVar61,auVar147);
                        auVar147 = *(undefined1 (*) [16])(ray + 0x40);
                        auVar49 = vfmadd231ps_fma(auVar148,auVar147,auVar149);
                        auVar71 = vsubps_avx(auVar163,auVar71);
                        auVar60 = vsubps_avx(auVar164,auVar60);
                        auVar129 = vsubps_avx(auVar174,auVar129);
                        auVar148 = vsubps_avx(auVar173,auVar60);
                        auVar97 = vsubps_avx(auVar97,auVar129);
                        auVar100._0_4_ = auVar173._0_4_ + auVar60._0_4_;
                        auVar100._4_4_ = auVar173._4_4_ + auVar60._4_4_;
                        auVar100._8_4_ = auVar173._8_4_ + auVar60._8_4_;
                        auVar100._12_4_ = auVar173._12_4_ + auVar60._12_4_;
                        auVar202._0_4_ = fVar48 + auVar129._0_4_;
                        auVar202._4_4_ = fVar1 + auVar129._4_4_;
                        auVar202._8_4_ = fVar2 + auVar129._8_4_;
                        auVar202._12_4_ = fVar3 + auVar129._12_4_;
                        fVar204 = auVar97._0_4_;
                        auVar167._0_4_ = fVar204 * auVar100._0_4_;
                        fVar206 = auVar97._4_4_;
                        auVar167._4_4_ = fVar206 * auVar100._4_4_;
                        fVar207 = auVar97._8_4_;
                        auVar167._8_4_ = fVar207 * auVar100._8_4_;
                        fVar208 = auVar97._12_4_;
                        auVar167._12_4_ = fVar208 * auVar100._12_4_;
                        auVar50 = vfmsub231ps_fma(auVar167,auVar148,auVar202);
                        auVar149 = vsubps_avx(auVar198,auVar71);
                        fVar4 = auVar149._0_4_;
                        auVar203._0_4_ = auVar202._0_4_ * fVar4;
                        fVar5 = auVar149._4_4_;
                        auVar203._4_4_ = auVar202._4_4_ * fVar5;
                        fVar6 = auVar149._8_4_;
                        auVar203._8_4_ = auVar202._8_4_ * fVar6;
                        fVar13 = auVar149._12_4_;
                        auVar203._12_4_ = auVar202._12_4_ * fVar13;
                        auVar177._0_4_ = auVar198._0_4_ + auVar71._0_4_;
                        auVar177._4_4_ = auVar198._4_4_ + auVar71._4_4_;
                        auVar177._8_4_ = auVar198._8_4_ + auVar71._8_4_;
                        auVar177._12_4_ = auVar198._12_4_ + auVar71._12_4_;
                        auVar162 = vfmsub231ps_fma(auVar203,auVar97,auVar177);
                        fVar191 = auVar148._0_4_;
                        auVar178._0_4_ = fVar191 * auVar177._0_4_;
                        fVar195 = auVar148._4_4_;
                        auVar178._4_4_ = fVar195 * auVar177._4_4_;
                        fVar196 = auVar148._8_4_;
                        auVar178._8_4_ = fVar196 * auVar177._8_4_;
                        fVar197 = auVar148._12_4_;
                        auVar178._12_4_ = fVar197 * auVar177._12_4_;
                        auVar73 = vfmsub231ps_fma(auVar178,auVar149,auVar100);
                        auVar151._0_4_ = fVar17 * auVar73._0_4_;
                        auVar151._4_4_ = fVar18 * auVar73._4_4_;
                        auVar151._8_4_ = fVar19 * auVar73._8_4_;
                        auVar151._12_4_ = fVar20 * auVar73._12_4_;
                        auVar162 = vfmadd231ps_fma(auVar151,auVar61,auVar162);
                        auVar50 = vfmadd231ps_fma(auVar162,auVar147,auVar50);
                        auVar162 = vsubps_avx(auVar71,auVar131);
                        auVar53._0_4_ = auVar131._0_4_ + auVar71._0_4_;
                        auVar53._4_4_ = auVar131._4_4_ + auVar71._4_4_;
                        auVar53._8_4_ = auVar131._8_4_ + auVar71._8_4_;
                        auVar53._12_4_ = auVar131._12_4_ + auVar71._12_4_;
                        auVar131 = vsubps_avx(auVar60,auVar117);
                        auVar75._0_4_ = auVar117._0_4_ + auVar60._0_4_;
                        auVar75._4_4_ = auVar117._4_4_ + auVar60._4_4_;
                        auVar75._8_4_ = auVar117._8_4_ + auVar60._8_4_;
                        auVar75._12_4_ = auVar117._12_4_ + auVar60._12_4_;
                        auVar117 = vsubps_avx(auVar129,auVar14);
                        auVar101._0_4_ = auVar129._0_4_ + auVar14._0_4_;
                        auVar101._4_4_ = auVar129._4_4_ + auVar14._4_4_;
                        auVar101._8_4_ = auVar129._8_4_ + auVar14._8_4_;
                        auVar101._12_4_ = auVar129._12_4_ + auVar14._12_4_;
                        auVar135._0_4_ = auVar117._0_4_ * auVar75._0_4_;
                        auVar135._4_4_ = auVar117._4_4_ * auVar75._4_4_;
                        auVar135._8_4_ = auVar117._8_4_ * auVar75._8_4_;
                        auVar135._12_4_ = auVar117._12_4_ * auVar75._12_4_;
                        auVar60 = vfmsub231ps_fma(auVar135,auVar131,auVar101);
                        auVar102._0_4_ = auVar162._0_4_ * auVar101._0_4_;
                        auVar102._4_4_ = auVar162._4_4_ * auVar101._4_4_;
                        auVar102._8_4_ = auVar162._8_4_ * auVar101._8_4_;
                        auVar102._12_4_ = auVar162._12_4_ * auVar101._12_4_;
                        auVar71 = vfmsub231ps_fma(auVar102,auVar117,auVar53);
                        auVar54._0_4_ = auVar131._0_4_ * auVar53._0_4_;
                        auVar54._4_4_ = auVar131._4_4_ * auVar53._4_4_;
                        auVar54._8_4_ = auVar131._8_4_ * auVar53._8_4_;
                        auVar54._12_4_ = auVar131._12_4_ * auVar53._12_4_;
                        auVar129 = vfmsub231ps_fma(auVar54,auVar162,auVar75);
                        auVar55._0_4_ = fVar17 * auVar129._0_4_;
                        auVar55._4_4_ = fVar18 * auVar129._4_4_;
                        auVar55._8_4_ = fVar19 * auVar129._8_4_;
                        auVar55._12_4_ = fVar20 * auVar129._12_4_;
                        auVar71 = vfmadd231ps_fma(auVar55,auVar61,auVar71);
                        auVar129 = vfmadd231ps_fma(auVar71,auVar147,auVar60);
                        auVar179._0_8_ =
                             CONCAT44(auVar129._4_4_ + auVar49._4_4_ + auVar50._4_4_,
                                      auVar129._0_4_ + auVar49._0_4_ + auVar50._0_4_);
                        auVar179._8_4_ = auVar129._8_4_ + auVar49._8_4_ + auVar50._8_4_;
                        auVar179._12_4_ = auVar129._12_4_ + auVar49._12_4_ + auVar50._12_4_;
                        auVar71 = vandps_avx(auVar179,auVar200);
                        auVar76._0_4_ = auVar71._0_4_ * 1.1920929e-07;
                        auVar76._4_4_ = auVar71._4_4_ * 1.1920929e-07;
                        auVar76._8_4_ = auVar71._8_4_ * 1.1920929e-07;
                        auVar76._12_4_ = auVar71._12_4_ * 1.1920929e-07;
                        auVar71 = vminps_avx(auVar49,auVar50);
                        auVar71 = vminps_avx(auVar71,auVar129);
                        uVar33 = CONCAT44(auVar76._4_4_,auVar76._0_4_);
                        auVar136._0_8_ = uVar33 ^ 0x8000000080000000;
                        auVar136._8_4_ = -auVar76._8_4_;
                        auVar136._12_4_ = -auVar76._12_4_;
                        auVar71 = vcmpps_avx(auVar71,auVar136,5);
                        auVar60 = vmaxps_avx(auVar49,auVar50);
                        auVar60 = vmaxps_avx(auVar60,auVar129);
                        auVar60 = vcmpps_avx(auVar60,auVar76,2);
                        auVar71 = vorps_avx(auVar71,auVar60);
                        auVar60 = auVar98 & auVar71;
                        auVar71 = vandps_avx(auVar71,auVar98);
                        if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar60[0xf] < '\0') {
                          auVar56._0_4_ = fVar191 * auVar118._0_4_;
                          auVar56._4_4_ = fVar195 * auVar118._4_4_;
                          auVar56._8_4_ = fVar196 * auVar118._8_4_;
                          auVar56._12_4_ = fVar197 * auVar118._12_4_;
                          auVar125._0_4_ = fVar4 * auVar15._0_4_;
                          auVar125._4_4_ = fVar5 * auVar15._4_4_;
                          auVar125._8_4_ = fVar6 * auVar15._8_4_;
                          auVar125._12_4_ = fVar13 * auVar15._12_4_;
                          auVar14 = vfmsub213ps_fma(auVar15,auVar97,auVar56);
                          auVar103._0_4_ = auVar131._0_4_ * fVar204;
                          auVar103._4_4_ = auVar131._4_4_ * fVar206;
                          auVar103._8_4_ = auVar131._8_4_ * fVar207;
                          auVar103._12_4_ = auVar131._12_4_ * fVar208;
                          auVar137._0_4_ = fVar4 * auVar117._0_4_;
                          auVar137._4_4_ = fVar5 * auVar117._4_4_;
                          auVar137._8_4_ = fVar6 * auVar117._8_4_;
                          auVar137._12_4_ = fVar13 * auVar117._12_4_;
                          auVar117 = vfmsub213ps_fma(auVar117,auVar148,auVar103);
                          auVar60 = vandps_avx(auVar56,auVar200);
                          auVar129 = vandps_avx(auVar103,auVar200);
                          auVar60 = vcmpps_avx(auVar60,auVar129,1);
                          auVar117 = vblendvps_avx(auVar117,auVar14,auVar60);
                          auVar57._0_4_ = auVar162._0_4_ * fVar191;
                          auVar57._4_4_ = auVar162._4_4_ * fVar195;
                          auVar57._8_4_ = auVar162._8_4_ * fVar196;
                          auVar57._12_4_ = auVar162._12_4_ * fVar197;
                          auVar97 = vfmsub213ps_fma(auVar162,auVar97,auVar137);
                          auVar168._0_4_ = auVar132._0_4_ * fVar204;
                          auVar168._4_4_ = auVar132._4_4_ * fVar206;
                          auVar168._8_4_ = auVar132._8_4_ * fVar207;
                          auVar168._12_4_ = auVar132._12_4_ * fVar208;
                          auVar14 = vfmsub213ps_fma(auVar118,auVar149,auVar168);
                          auVar60 = vandps_avx(auVar168,auVar200);
                          auVar129 = vandps_avx(auVar137,auVar200);
                          auVar60 = vcmpps_avx(auVar60,auVar129,1);
                          auVar97 = vblendvps_avx(auVar97,auVar14,auVar60);
                          auVar14 = vfmsub213ps_fma(auVar132,auVar148,auVar125);
                          auVar15 = vfmsub213ps_fma(auVar131,auVar149,auVar57);
                          auVar60 = vandps_avx(auVar125,auVar200);
                          auVar129 = vandps_avx(auVar57,auVar200);
                          auVar60 = vcmpps_avx(auVar60,auVar129,1);
                          auVar129 = vblendvps_avx(auVar15,auVar14,auVar60);
                          local_1c08 = auVar22._0_4_;
                          fStack_1c04 = auVar22._4_4_;
                          fStack_1c00 = auVar22._8_4_;
                          auVar58._0_4_ = auVar129._0_4_ * local_1c08;
                          auVar58._4_4_ = auVar129._4_4_ * fStack_1c04;
                          auVar58._8_4_ = auVar129._8_4_ * fStack_1c00;
                          auVar58._12_4_ = auVar129._12_4_ * fVar20;
                          auVar60 = vfmadd213ps_fma(auVar61,auVar97,auVar58);
                          auVar60 = vfmadd213ps_fma(auVar147,auVar117,auVar60);
                          auVar59._0_4_ = auVar60._0_4_ + auVar60._0_4_;
                          auVar59._4_4_ = auVar60._4_4_ + auVar60._4_4_;
                          auVar59._8_4_ = auVar60._8_4_ + auVar60._8_4_;
                          auVar59._12_4_ = auVar60._12_4_ + auVar60._12_4_;
                          auVar77._0_4_ = auVar129._0_4_ * fVar48;
                          auVar77._4_4_ = auVar129._4_4_ * fVar1;
                          auVar77._8_4_ = auVar129._8_4_ * fVar2;
                          auVar77._12_4_ = auVar129._12_4_ * fVar3;
                          auVar60 = vfmadd213ps_fma(auVar173,auVar97,auVar77);
                          auVar61 = vfmadd213ps_fma(auVar198,auVar117,auVar60);
                          auVar60 = vrcpps_avx(auVar59);
                          auVar189._8_4_ = 0x3f800000;
                          auVar189._0_8_ = 0x3f8000003f800000;
                          auVar189._12_4_ = 0x3f800000;
                          auVar147 = vfnmadd213ps_fma(auVar60,auVar59,auVar189);
                          auVar60 = vfmadd132ps_fma(auVar147,auVar60,auVar60);
                          auVar78._0_4_ = auVar60._0_4_ * (auVar61._0_4_ + auVar61._0_4_);
                          auVar78._4_4_ = auVar60._4_4_ * (auVar61._4_4_ + auVar61._4_4_);
                          auVar78._8_4_ = auVar60._8_4_ * (auVar61._8_4_ + auVar61._8_4_);
                          auVar78._12_4_ = auVar60._12_4_ * (auVar61._12_4_ + auVar61._12_4_);
                          auVar60 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar78,2);
                          auVar61 = vcmpps_avx(auVar78,*(undefined1 (*) [16])(ray + 0x80),2);
                          auVar60 = vandps_avx(auVar61,auVar60);
                          uVar33 = CONCAT44(auVar59._4_4_,auVar59._0_4_);
                          auVar184._0_8_ = uVar33 ^ 0x8000000080000000;
                          auVar184._8_4_ = -auVar59._8_4_;
                          auVar184._12_4_ = -auVar59._12_4_;
                          auVar61 = vcmpps_avx(auVar184,auVar59,4);
                          auVar60 = vandps_avx(auVar61,auVar60);
                          auVar60 = vpslld_avx(auVar60,0x1f);
                          auVar61 = vpsrad_avx(auVar60,0x1f);
                          auVar60 = auVar71 & auVar61;
                          auVar71 = vandps_avx(auVar71,auVar61);
                          if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar60 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar60[0xf] < '\0') {
                            local_1ae8 = auVar49._0_8_;
                            uStack_1ae0 = auVar49._8_8_;
                            local_1888 = local_1ae8;
                            uStack_1880 = uStack_1ae0;
                            uStack_1820 = auVar179._8_8_;
                            uStack_18a0 = uStack_1820;
                            local_18e8 = auVar129;
                            local_18d8 = auVar97;
                            local_18c8 = auVar117;
                            local_18b8 = auVar78;
                            local_18a8 = auVar179._0_8_;
                            _local_1898 = auVar50;
                          }
                        }
                        auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                        fVar48 = *(float *)(local_1b70 + lVar34 + 0x30);
                        fVar1 = *(float *)(local_1b68 + lVar34 + 0x30);
                        fVar2 = *(float *)(local_1b60 + lVar34 + 0x30);
                        uVar27 = *(undefined4 *)(local_1b78 + lVar34);
                        auVar152._4_4_ = uVar27;
                        auVar152._0_4_ = uVar27;
                        auVar152._8_4_ = uVar27;
                        auVar152._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(local_1b88 + lVar34);
                        auVar169._4_4_ = uVar27;
                        auVar169._0_4_ = uVar27;
                        auVar169._8_4_ = uVar27;
                        auVar169._12_4_ = uVar27;
                        uVar27 = *(undefined4 *)(local_1b80 + lVar34);
                        auVar185._4_4_ = uVar27;
                        auVar185._0_4_ = uVar27;
                        auVar185._8_4_ = uVar27;
                        auVar185._12_4_ = uVar27;
                        uVar16 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                        pGVar10 = (context->scene->geometries).items[uVar16].ptr;
                        uVar26 = pGVar10->mask;
                        auVar79._4_4_ = uVar26;
                        auVar79._0_4_ = uVar26;
                        auVar79._8_4_ = uVar26;
                        auVar79._12_4_ = uVar26;
                        auVar60 = vpand_avx(auVar79,*(undefined1 (*) [16])(ray + 0x90));
                        auVar60 = vpcmpeqd_avx(auVar60,_DAT_01f45a50);
                        auVar129 = auVar71 & ~auVar60;
                        if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar129 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar129 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar129[0xf] < '\0') {
                          uVar27 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                          auVar71 = vandnps_avx(auVar60,auVar71);
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar21._8_8_ = uStack_18a0;
                            auVar21._0_8_ = local_18a8;
                            auVar60 = vandps_avx(auVar21,auVar200);
                            auVar129 = vrcpps_avx(auVar21);
                            auVar158._8_4_ = 0x3f800000;
                            auVar158._0_8_ = 0x3f8000003f800000;
                            auVar158._12_4_ = 0x3f800000;
                            auVar61 = vfnmadd213ps_fma(auVar129,auVar21,auVar158);
                            auVar129 = vfmadd132ps_fma(auVar61,auVar129,auVar129);
                            auVar86._8_4_ = 0x219392ef;
                            auVar86._0_8_ = 0x219392ef219392ef;
                            auVar86._12_4_ = 0x219392ef;
                            auVar60 = vcmpps_avx(auVar60,auVar86,5);
                            auVar60 = vandps_avx(auVar60,auVar129);
                            auVar67._0_4_ = auVar60._0_4_ * (float)local_1888;
                            auVar67._4_4_ = auVar60._4_4_ * local_1888._4_4_;
                            auVar67._8_4_ = auVar60._8_4_ * (float)uStack_1880;
                            auVar67._12_4_ = auVar60._12_4_ * uStack_1880._4_4_;
                            auVar61 = vminps_avx(auVar67,auVar158);
                            auVar87._0_4_ = auVar60._0_4_ * (float)local_1898._0_4_;
                            auVar87._4_4_ = auVar60._4_4_ * (float)local_1898._4_4_;
                            auVar87._8_4_ = auVar60._8_4_ * fStack_1890;
                            auVar87._12_4_ = auVar60._12_4_ * fStack_188c;
                            auVar147 = vminps_avx(auVar87,auVar158);
                            uVar7 = *(undefined4 *)(local_1c20 + lVar34 + -4);
                            auVar109._4_4_ = uVar7;
                            auVar109._0_4_ = uVar7;
                            auVar109._8_4_ = uVar7;
                            auVar109._12_4_ = uVar7;
                            auVar129 = vpsrld_avx(auVar109,0x10);
                            auVar60 = vpblendw_avx(auVar109,(undefined1  [16])0x0,0xaa);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar129 = vcvtdq2ps_avx(auVar129);
                            uVar7 = *(undefined4 *)(local_1b98 + lVar34 + 0x2c);
                            auVar141._4_4_ = uVar7;
                            auVar141._0_4_ = uVar7;
                            auVar141._8_4_ = uVar7;
                            auVar141._12_4_ = uVar7;
                            auVar198 = vsubps_avx(auVar158,auVar61);
                            auVar198 = vsubps_avx(auVar198,auVar147);
                            auVar110._0_4_ = auVar198._0_4_ * auVar60._0_4_ * 0.00012207031;
                            auVar110._4_4_ = auVar198._4_4_ * auVar60._4_4_ * 0.00012207031;
                            auVar110._8_4_ = auVar198._8_4_ * auVar60._8_4_ * 0.00012207031;
                            auVar110._12_4_ = auVar198._12_4_ * auVar60._12_4_ * 0.00012207031;
                            auVar128._0_4_ = auVar198._0_4_ * auVar129._0_4_ * 0.00012207031;
                            auVar128._4_4_ = auVar198._4_4_ * auVar129._4_4_ * 0.00012207031;
                            auVar128._8_4_ = auVar198._8_4_ * auVar129._8_4_ * 0.00012207031;
                            auVar128._12_4_ = auVar198._12_4_ * auVar129._12_4_ * 0.00012207031;
                            auVar60 = vpblendw_avx(auVar141,(undefined1  [16])0x0,0xaa);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar159._0_4_ = auVar60._0_4_ * 0.00012207031;
                            auVar159._4_4_ = auVar60._4_4_ * 0.00012207031;
                            auVar159._8_4_ = auVar60._8_4_ * 0.00012207031;
                            auVar159._12_4_ = auVar60._12_4_ * 0.00012207031;
                            auVar129 = vfmadd231ps_fma(auVar110,auVar147,auVar159);
                            auVar60 = vpsrld_avx(auVar141,0x10);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar142._0_4_ = auVar60._0_4_ * 0.00012207031;
                            auVar142._4_4_ = auVar60._4_4_ * 0.00012207031;
                            auVar142._8_4_ = auVar60._8_4_ * 0.00012207031;
                            auVar142._12_4_ = auVar60._12_4_ * 0.00012207031;
                            auVar147 = vfmadd231ps_fma(auVar128,auVar147,auVar142);
                            uVar7 = *(undefined4 *)(local_1c20 + lVar34);
                            auVar88._4_4_ = uVar7;
                            auVar88._0_4_ = uVar7;
                            auVar88._8_4_ = uVar7;
                            auVar88._12_4_ = uVar7;
                            auVar60 = vpblendw_avx(auVar88,(undefined1  [16])0x0,0xaa);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar143._0_4_ = auVar60._0_4_ * 0.00012207031;
                            auVar143._4_4_ = auVar60._4_4_ * 0.00012207031;
                            auVar143._8_4_ = auVar60._8_4_ * 0.00012207031;
                            auVar143._12_4_ = auVar60._12_4_ * 0.00012207031;
                            local_1a28 = vfmadd231ps_fma(auVar129,auVar61,auVar143);
                            auVar60 = vpsrld_avx(auVar88,0x10);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar89._0_4_ = auVar60._0_4_ * 0.00012207031;
                            auVar89._4_4_ = auVar60._4_4_ * 0.00012207031;
                            auVar89._8_4_ = auVar60._8_4_ * 0.00012207031;
                            auVar89._12_4_ = auVar60._12_4_ * 0.00012207031;
                            local_1a38 = vfmadd231ps_fma(auVar147,auVar61,auVar89);
                            local_1a78._0_8_ = local_18c8._0_8_;
                            local_1a78._8_8_ = local_18c8._8_8_;
                            local_1a78._16_8_ = local_18d8._0_8_;
                            local_1a78._24_8_ = local_18d8._8_8_;
                            local_1a78._32_8_ = local_18e8._0_8_;
                            local_1a78._40_8_ = local_18e8._8_8_;
                            local_1a48 = local_18b8._0_8_;
                            uStack_1a40 = local_18b8._8_8_;
                            args.valid = (int *)&Ng;
                            args.geometryUserPtr = &t;
                            args.context = (RTCRayQueryContext *)&v;
                            args.ray = (RTCRayN *)&u;
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                            ::
                            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                 *)&local_1a78.field_0);
                            local_1a18._4_4_ = uVar16;
                            local_1a18._0_4_ = uVar16;
                            local_1a18._8_4_ = uVar16;
                            local_1a18._12_4_ = uVar16;
                            local_1a78._0_8_ = Ng.field_0._0_8_;
                            local_1a78._8_8_ = Ng.field_0._8_8_;
                            local_1a78._16_8_ = Ng.field_0._16_8_;
                            local_1a78._24_8_ = Ng.field_0._24_8_;
                            local_1a78._32_8_ = Ng.field_0._32_8_;
                            local_1a78._40_8_ = Ng.field_0._40_8_;
                            local_1a48 = u.field_0._0_8_;
                            uStack_1a40 = u.field_0._8_8_;
                            local_1a28._4_4_ = uVar27;
                            local_1a28._0_4_ = uVar27;
                            local_1a28._8_4_ = uVar27;
                            local_1a28._12_4_ = uVar27;
                            vpcmpeqd_avx2(ZEXT1632(local_1a18),ZEXT1632(local_1a18));
                            uStack_1a04 = context->user->instID[0];
                            local_1a08 = uStack_1a04;
                            uStack_1a00 = uStack_1a04;
                            uStack_19fc = uStack_1a04;
                            uStack_19f8 = context->user->instPrimID[0];
                            uStack_19f4 = uStack_19f8;
                            uStack_19f0 = uStack_19f8;
                            uStack_19ec = uStack_19f8;
                            auVar60 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar129 = vblendvps_avx(auVar60,(undefined1  [16])t.field_0,auVar71);
                            *(undefined1 (*) [16])(ray + 0x80) = auVar129;
                            args.valid = (int *)local_1bb8;
                            args.geometryUserPtr = pGVar10->userPtr;
                            args.context = context->user;
                            args.hit = (RTCHitN *)&local_1a78;
                            args.N = 4;
                            args.ray = (RTCRayN *)ray;
                            local_1bb8 = auVar71;
                            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar96._0_8_ = (*pGVar10->occlusionFilterN)(&args);
                              auVar96._8_56_ = extraout_var;
                              auVar129 = auVar96._0_16_;
                            }
                            if (local_1bb8 == (undefined1  [16])0x0) {
                              auVar71 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                              auVar71 = auVar71 ^ _DAT_01f46b70;
                              auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                            }
                            else {
                              p_Var11 = context->args->filter;
                              if (p_Var11 == (RTCFilterFunctionN)0x0) {
                                auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                              else {
                                auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                                  auVar214._0_8_ = (*p_Var11)(&args);
                                  auVar214._8_56_ = extraout_var_00;
                                  auVar129 = auVar214._0_16_;
                                  auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                                CONCAT48(0x7f800000,
                                                                         0x7f8000007f800000)));
                                }
                              }
                              auVar61 = vpcmpeqd_avx(local_1bb8,_DAT_01f45a50);
                              auVar71 = vpcmpeqd_avx(auVar129,auVar129);
                              auVar71 = auVar61 ^ auVar71;
                              auVar113._8_4_ = 0xff800000;
                              auVar113._0_8_ = 0xff800000ff800000;
                              auVar113._12_4_ = 0xff800000;
                              auVar129 = vblendvps_avx(auVar113,*(undefined1 (*) [16])
                                                                 (args.ray + 0x80),auVar61);
                              *(undefined1 (*) [16])(args.ray + 0x80) = auVar129;
                            }
                            auVar129 = vpslld_avx(auVar71,0x1f);
                            auVar71 = vpsrad_avx(auVar129,0x1f);
                            auVar60 = vblendvps_avx(auVar60,*(undefined1 (*) [16])local_1ba0,
                                                    auVar129);
                            *(undefined1 (*) [16])local_1ba0 = auVar60;
                          }
                          auVar98 = vpandn_avx(auVar71,auVar98);
                        }
                        auVar96 = ZEXT1664(auVar98);
                        if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar98 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar98 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar98[0xf]) break;
                        auVar62._0_4_ = (float)local_19d8._0_4_ * fVar48;
                        auVar62._4_4_ = (float)local_19d8._4_4_ * fVar48;
                        auVar62._8_4_ = fStack_19d0 * fVar48;
                        auVar62._12_4_ = fStack_19cc * fVar48;
                        auVar80._0_4_ = (float)local_19d8._0_4_ * fVar1;
                        auVar80._4_4_ = (float)local_19d8._4_4_ * fVar1;
                        auVar80._8_4_ = fStack_19d0 * fVar1;
                        auVar80._12_4_ = fStack_19cc * fVar1;
                        auVar104._0_4_ = fVar2 * (float)local_19d8._0_4_;
                        auVar104._4_4_ = fVar2 * (float)local_19d8._4_4_;
                        auVar104._8_4_ = fVar2 * fStack_19d0;
                        auVar104._12_4_ = fVar2 * fStack_19cc;
                        auVar14 = vfmadd213ps_fma(auVar152,local_19e8,auVar62);
                        auVar15 = vfmadd213ps_fma(auVar169,local_19e8,auVar80);
                        auVar118 = vfmadd213ps_fma(auVar185,local_19e8,auVar104);
                        auVar71 = *(undefined1 (*) [16])ray;
                        auVar60 = *(undefined1 (*) [16])(ray + 0x10);
                        auVar129 = *(undefined1 (*) [16])(ray + 0x20);
                        auVar147 = vsubps_avx(auVar182,auVar71);
                        auVar198 = vsubps_avx(auVar119,auVar60);
                        auVar61 = vsubps_avx(auVar133,auVar129);
                        auVar173 = vsubps_avx(auVar163,auVar71);
                        auVar97 = vsubps_avx(auVar164,auVar60);
                        auVar117 = vsubps_avx(auVar174,auVar129);
                        auVar14 = vsubps_avx(auVar14,auVar71);
                        auVar15 = vsubps_avx(auVar15,auVar60);
                        auVar129 = vsubps_avx(auVar118,auVar129);
                        auVar118 = vsubps_avx(auVar14,auVar147);
                        auVar131 = vsubps_avx(auVar15,auVar198);
                        auVar132 = vsubps_avx(auVar129,auVar61);
                        auVar126._0_4_ = auVar14._0_4_ + auVar147._0_4_;
                        auVar126._4_4_ = auVar14._4_4_ + auVar147._4_4_;
                        auVar126._8_4_ = auVar14._8_4_ + auVar147._8_4_;
                        auVar126._12_4_ = auVar14._12_4_ + auVar147._12_4_;
                        auVar170._0_4_ = auVar198._0_4_ + auVar15._0_4_;
                        auVar170._4_4_ = auVar198._4_4_ + auVar15._4_4_;
                        auVar170._8_4_ = auVar198._8_4_ + auVar15._8_4_;
                        auVar170._12_4_ = auVar198._12_4_ + auVar15._12_4_;
                        fVar204 = auVar61._0_4_;
                        auVar186._0_4_ = fVar204 + auVar129._0_4_;
                        fVar206 = auVar61._4_4_;
                        auVar186._4_4_ = fVar206 + auVar129._4_4_;
                        fVar207 = auVar61._8_4_;
                        auVar186._8_4_ = fVar207 + auVar129._8_4_;
                        fVar208 = auVar61._12_4_;
                        auVar186._12_4_ = fVar208 + auVar129._12_4_;
                        auVar199._0_4_ = auVar132._0_4_ * auVar170._0_4_;
                        auVar199._4_4_ = auVar132._4_4_ * auVar170._4_4_;
                        auVar199._8_4_ = auVar132._8_4_ * auVar170._8_4_;
                        auVar199._12_4_ = auVar132._12_4_ * auVar170._12_4_;
                        auVar149 = vfmsub231ps_fma(auVar199,auVar131,auVar186);
                        auVar194._0_4_ = auVar186._0_4_ * auVar118._0_4_;
                        auVar194._4_4_ = auVar186._4_4_ * auVar118._4_4_;
                        auVar194._8_4_ = auVar186._8_4_ * auVar118._8_4_;
                        auVar194._12_4_ = auVar186._12_4_ * auVar118._12_4_;
                        auVar60 = vfmsub231ps_fma(auVar194,auVar132,auVar126);
                        auVar127._0_4_ = auVar126._0_4_ * auVar131._0_4_;
                        auVar127._4_4_ = auVar126._4_4_ * auVar131._4_4_;
                        auVar127._8_4_ = auVar126._8_4_ * auVar131._8_4_;
                        auVar127._12_4_ = auVar126._12_4_ * auVar131._12_4_;
                        auVar71 = vfmsub231ps_fma(auVar127,auVar118,auVar170);
                        fVar17 = *(float *)(ray + 0x60);
                        fVar18 = *(float *)(ray + 100);
                        fVar19 = *(float *)(ray + 0x68);
                        auVar22 = *(undefined1 (*) [12])(ray + 0x60);
                        fVar20 = *(float *)(ray + 0x6c);
                        auVar209._0_4_ = fVar17 * auVar71._0_4_;
                        auVar209._4_4_ = fVar18 * auVar71._4_4_;
                        auVar209._8_4_ = fVar19 * auVar71._8_4_;
                        auVar209._12_4_ = fVar20 * auVar71._12_4_;
                        auVar71 = *(undefined1 (*) [16])(ray + 0x50);
                        auVar148 = vfmadd231ps_fma(auVar209,auVar71,auVar60);
                        auVar60 = *(undefined1 (*) [16])(ray + 0x40);
                        auVar164 = vfmadd231ps_fma(auVar148,auVar60,auVar149);
                        auVar148 = vsubps_avx(auVar198,auVar97);
                        auVar149 = vsubps_avx(auVar61,auVar117);
                        auVar171._0_4_ = auVar198._0_4_ + auVar97._0_4_;
                        auVar171._4_4_ = auVar198._4_4_ + auVar97._4_4_;
                        auVar171._8_4_ = auVar198._8_4_ + auVar97._8_4_;
                        auVar171._12_4_ = auVar198._12_4_ + auVar97._12_4_;
                        auVar212._0_4_ = fVar204 + auVar117._0_4_;
                        auVar212._4_4_ = fVar206 + auVar117._4_4_;
                        auVar212._8_4_ = fVar207 + auVar117._8_4_;
                        auVar212._12_4_ = fVar208 + auVar117._12_4_;
                        fVar191 = auVar149._0_4_;
                        auVar153._0_4_ = fVar191 * auVar171._0_4_;
                        fVar195 = auVar149._4_4_;
                        auVar153._4_4_ = fVar195 * auVar171._4_4_;
                        fVar196 = auVar149._8_4_;
                        auVar153._8_4_ = fVar196 * auVar171._8_4_;
                        fVar197 = auVar149._12_4_;
                        auVar153._12_4_ = fVar197 * auVar171._12_4_;
                        auVar163 = vfmsub231ps_fma(auVar153,auVar148,auVar212);
                        auVar162 = vsubps_avx(auVar147,auVar173);
                        fVar48 = auVar162._0_4_;
                        auVar213._0_4_ = auVar212._0_4_ * fVar48;
                        fVar2 = auVar162._4_4_;
                        auVar213._4_4_ = auVar212._4_4_ * fVar2;
                        fVar4 = auVar162._8_4_;
                        auVar213._8_4_ = auVar212._8_4_ * fVar4;
                        fVar6 = auVar162._12_4_;
                        auVar213._12_4_ = auVar212._12_4_ * fVar6;
                        auVar180._0_4_ = auVar173._0_4_ + auVar147._0_4_;
                        auVar180._4_4_ = auVar173._4_4_ + auVar147._4_4_;
                        auVar180._8_4_ = auVar173._8_4_ + auVar147._8_4_;
                        auVar180._12_4_ = auVar173._12_4_ + auVar147._12_4_;
                        auVar61 = vfmsub231ps_fma(auVar213,auVar149,auVar180);
                        fVar1 = auVar148._0_4_;
                        auVar181._0_4_ = auVar180._0_4_ * fVar1;
                        fVar3 = auVar148._4_4_;
                        auVar181._4_4_ = auVar180._4_4_ * fVar3;
                        fVar5 = auVar148._8_4_;
                        auVar181._8_4_ = auVar180._8_4_ * fVar5;
                        fVar13 = auVar148._12_4_;
                        auVar181._12_4_ = auVar180._12_4_ * fVar13;
                        auVar174 = vfmsub231ps_fma(auVar181,auVar162,auVar171);
                        auVar172._0_4_ = fVar17 * auVar174._0_4_;
                        auVar172._4_4_ = fVar18 * auVar174._4_4_;
                        auVar172._8_4_ = fVar19 * auVar174._8_4_;
                        auVar172._12_4_ = fVar20 * auVar174._12_4_;
                        auVar61 = vfmadd231ps_fma(auVar172,auVar71,auVar61);
                        auVar174 = vfmadd231ps_fma(auVar61,auVar60,auVar163);
                        auVar163 = vsubps_avx(auVar173,auVar14);
                        auVar81._0_4_ = auVar173._0_4_ + auVar14._0_4_;
                        auVar81._4_4_ = auVar173._4_4_ + auVar14._4_4_;
                        auVar81._8_4_ = auVar173._8_4_ + auVar14._8_4_;
                        auVar81._12_4_ = auVar173._12_4_ + auVar14._12_4_;
                        auVar173 = vsubps_avx(auVar97,auVar15);
                        auVar63._0_4_ = auVar97._0_4_ + auVar15._0_4_;
                        auVar63._4_4_ = auVar97._4_4_ + auVar15._4_4_;
                        auVar63._8_4_ = auVar97._8_4_ + auVar15._8_4_;
                        auVar63._12_4_ = auVar97._12_4_ + auVar15._12_4_;
                        auVar97 = vsubps_avx(auVar117,auVar129);
                        auVar105._0_4_ = auVar117._0_4_ + auVar129._0_4_;
                        auVar105._4_4_ = auVar117._4_4_ + auVar129._4_4_;
                        auVar105._8_4_ = auVar117._8_4_ + auVar129._8_4_;
                        auVar105._12_4_ = auVar117._12_4_ + auVar129._12_4_;
                        auVar138._0_4_ = auVar97._0_4_ * auVar63._0_4_;
                        auVar138._4_4_ = auVar97._4_4_ * auVar63._4_4_;
                        auVar138._8_4_ = auVar97._8_4_ * auVar63._8_4_;
                        auVar138._12_4_ = auVar97._12_4_ * auVar63._12_4_;
                        auVar61 = vfmsub231ps_fma(auVar138,auVar173,auVar105);
                        auVar106._0_4_ = auVar163._0_4_ * auVar105._0_4_;
                        auVar106._4_4_ = auVar163._4_4_ * auVar105._4_4_;
                        auVar106._8_4_ = auVar163._8_4_ * auVar105._8_4_;
                        auVar106._12_4_ = auVar163._12_4_ * auVar105._12_4_;
                        auVar129 = vfmsub231ps_fma(auVar106,auVar97,auVar81);
                        auVar82._0_4_ = auVar173._0_4_ * auVar81._0_4_;
                        auVar82._4_4_ = auVar173._4_4_ * auVar81._4_4_;
                        auVar82._8_4_ = auVar173._8_4_ * auVar81._8_4_;
                        auVar82._12_4_ = auVar173._12_4_ * auVar81._12_4_;
                        auVar117 = vfmsub231ps_fma(auVar82,auVar163,auVar63);
                        auVar64._0_4_ = fVar17 * auVar117._0_4_;
                        auVar64._4_4_ = fVar18 * auVar117._4_4_;
                        auVar64._8_4_ = fVar19 * auVar117._8_4_;
                        auVar64._12_4_ = fVar20 * auVar117._12_4_;
                        auVar129 = vfmadd231ps_fma(auVar64,auVar71,auVar129);
                        auVar117 = vfmadd231ps_fma(auVar129,auVar60,auVar61);
                        auVar154._0_4_ = auVar117._0_4_ + auVar164._0_4_ + auVar174._0_4_;
                        auVar154._4_4_ = auVar117._4_4_ + auVar164._4_4_ + auVar174._4_4_;
                        auVar154._8_4_ = auVar117._8_4_ + auVar164._8_4_ + auVar174._8_4_;
                        auVar154._12_4_ = auVar117._12_4_ + auVar164._12_4_ + auVar174._12_4_;
                        auVar129 = vandps_avx(auVar200,auVar154);
                        auVar83._0_4_ = auVar129._0_4_ * 1.1920929e-07;
                        auVar83._4_4_ = auVar129._4_4_ * 1.1920929e-07;
                        auVar83._8_4_ = auVar129._8_4_ * 1.1920929e-07;
                        auVar83._12_4_ = auVar129._12_4_ * 1.1920929e-07;
                        auVar129 = vminps_avx(auVar164,auVar174);
                        auVar129 = vminps_avx(auVar129,auVar117);
                        uVar33 = CONCAT44(auVar83._4_4_,auVar83._0_4_);
                        auVar139._0_8_ = uVar33 ^ 0x8000000080000000;
                        auVar139._8_4_ = -auVar83._8_4_;
                        auVar139._12_4_ = -auVar83._12_4_;
                        auVar129 = vcmpps_avx(auVar129,auVar139,5);
                        auVar61 = vmaxps_avx(auVar164,auVar174);
                        auVar61 = vmaxps_avx(auVar61,auVar117);
                        auVar61 = vcmpps_avx(auVar61,auVar83,2);
                        auVar129 = vorps_avx(auVar129,auVar61);
                        auVar61 = auVar98 & auVar129;
                        auVar129 = vandps_avx(auVar129,auVar98);
                        if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar61[0xf] < '\0') {
                          auVar65._0_4_ = fVar1 * auVar132._0_4_;
                          auVar65._4_4_ = fVar3 * auVar132._4_4_;
                          auVar65._8_4_ = fVar5 * auVar132._8_4_;
                          auVar65._12_4_ = fVar13 * auVar132._12_4_;
                          local_1c18._4_4_ = fVar2 * auVar131._4_4_;
                          local_1c18._0_4_ = fVar48 * auVar131._0_4_;
                          fStack_1c10 = fVar4 * auVar131._8_4_;
                          fStack_1c0c = fVar6 * auVar131._12_4_;
                          auVar117 = vfmsub213ps_fma(auVar131,auVar149,auVar65);
                          auVar107._0_4_ = auVar173._0_4_ * fVar191;
                          auVar107._4_4_ = auVar173._4_4_ * fVar195;
                          auVar107._8_4_ = auVar173._8_4_ * fVar196;
                          auVar107._12_4_ = auVar173._12_4_ * fVar197;
                          auVar140._0_4_ = fVar48 * auVar97._0_4_;
                          auVar140._4_4_ = fVar2 * auVar97._4_4_;
                          auVar140._8_4_ = fVar4 * auVar97._8_4_;
                          auVar140._12_4_ = fVar6 * auVar97._12_4_;
                          auVar14 = vfmsub213ps_fma(auVar97,auVar148,auVar107);
                          auVar61 = vandps_avx(auVar200,auVar65);
                          auVar97 = vandps_avx(auVar200,auVar107);
                          auVar61 = vcmpps_avx(auVar61,auVar97,1);
                          auVar117 = vblendvps_avx(auVar14,auVar117,auVar61);
                          auVar155._0_4_ = auVar163._0_4_ * fVar1;
                          auVar155._4_4_ = auVar163._4_4_ * fVar3;
                          auVar155._8_4_ = auVar163._8_4_ * fVar5;
                          auVar155._12_4_ = auVar163._12_4_ * fVar13;
                          auVar14 = vfmsub213ps_fma(auVar163,auVar149,auVar140);
                          auVar108._0_4_ = fVar191 * auVar118._0_4_;
                          auVar108._4_4_ = fVar195 * auVar118._4_4_;
                          auVar108._8_4_ = fVar196 * auVar118._8_4_;
                          auVar108._12_4_ = fVar197 * auVar118._12_4_;
                          auVar15 = vfmsub213ps_fma(auVar132,auVar162,auVar108);
                          auVar61 = vandps_avx(auVar200,auVar108);
                          auVar97 = vandps_avx(auVar200,auVar140);
                          auVar61 = vcmpps_avx(auVar61,auVar97,1);
                          auVar97 = vblendvps_avx(auVar14,auVar15,auVar61);
                          auVar14 = vfmsub213ps_fma(auVar118,auVar148,_local_1c18);
                          auVar15 = vfmsub213ps_fma(auVar173,auVar162,auVar155);
                          auVar61 = vandps_avx(auVar200,_local_1c18);
                          auVar173 = vandps_avx(auVar200,auVar155);
                          auVar61 = vcmpps_avx(auVar61,auVar173,1);
                          auVar61 = vblendvps_avx(auVar15,auVar14,auVar61);
                          local_1cd8._0_4_ = auVar22._0_4_;
                          local_1cd8._4_4_ = auVar22._4_4_;
                          fStack_1cd0 = auVar22._8_4_;
                          auVar84._0_4_ = auVar61._0_4_ * (float)local_1cd8._0_4_;
                          auVar84._4_4_ = auVar61._4_4_ * (float)local_1cd8._4_4_;
                          auVar84._8_4_ = auVar61._8_4_ * fStack_1cd0;
                          auVar84._12_4_ = auVar61._12_4_ * fVar20;
                          auVar71 = vfmadd213ps_fma(auVar71,auVar97,auVar84);
                          auVar71 = vfmadd213ps_fma(auVar60,auVar117,auVar71);
                          auVar85._0_4_ = auVar71._0_4_ + auVar71._0_4_;
                          auVar85._4_4_ = auVar71._4_4_ + auVar71._4_4_;
                          auVar85._8_4_ = auVar71._8_4_ + auVar71._8_4_;
                          auVar85._12_4_ = auVar71._12_4_ + auVar71._12_4_;
                          auVar156._0_4_ = auVar61._0_4_ * fVar204;
                          auVar156._4_4_ = auVar61._4_4_ * fVar206;
                          auVar156._8_4_ = auVar61._8_4_ * fVar207;
                          auVar156._12_4_ = auVar61._12_4_ * fVar208;
                          auVar71 = vfmadd213ps_fma(auVar198,auVar97,auVar156);
                          auVar60 = vfmadd213ps_fma(auVar147,auVar117,auVar71);
                          auVar71 = vrcpps_avx(auVar85);
                          auVar190._8_4_ = 0x3f800000;
                          auVar190._0_8_ = 0x3f8000003f800000;
                          auVar190._12_4_ = 0x3f800000;
                          auVar147 = vfnmadd213ps_fma(auVar71,auVar85,auVar190);
                          auVar71 = vfmadd132ps_fma(auVar147,auVar71,auVar71);
                          auVar157._0_4_ = auVar71._0_4_ * (auVar60._0_4_ + auVar60._0_4_);
                          auVar157._4_4_ = auVar71._4_4_ * (auVar60._4_4_ + auVar60._4_4_);
                          auVar157._8_4_ = auVar71._8_4_ * (auVar60._8_4_ + auVar60._8_4_);
                          auVar157._12_4_ = auVar71._12_4_ * (auVar60._12_4_ + auVar60._12_4_);
                          auVar71 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar157,2);
                          auVar60 = vcmpps_avx(auVar157,*(undefined1 (*) [16])(ray + 0x80),2);
                          auVar71 = vandps_avx(auVar60,auVar71);
                          uVar33 = CONCAT44(auVar85._4_4_,auVar85._0_4_);
                          auVar187._0_8_ = uVar33 ^ 0x8000000080000000;
                          auVar187._8_4_ = -auVar85._8_4_;
                          auVar187._12_4_ = -auVar85._12_4_;
                          auVar60 = vcmpps_avx(auVar187,auVar85,4);
                          auVar71 = vandps_avx(auVar60,auVar71);
                          auVar71 = vpslld_avx(auVar71,0x1f);
                          auVar60 = vpsrad_avx(auVar71,0x1f);
                          auVar71 = auVar129 & auVar60;
                          auVar129 = vandps_avx(auVar60,auVar129);
                          if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar71 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar71[0xf] < '\0') {
                            local_1958 = auVar61;
                            local_1948 = auVar97;
                            local_1938 = auVar117;
                            local_1928 = auVar157;
                            local_1918 = auVar154;
                            _local_1908 = auVar174;
                            _local_18f8 = auVar164;
                          }
                        }
                        auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                      CONCAT48(0x7f800000,0x7f8000007f800000)));
                        uVar16 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                        pGVar10 = (context->scene->geometries).items[uVar16].ptr;
                        uVar26 = pGVar10->mask;
                        auVar66._4_4_ = uVar26;
                        auVar66._0_4_ = uVar26;
                        auVar66._8_4_ = uVar26;
                        auVar66._12_4_ = uVar26;
                        auVar71 = vpand_avx(auVar66,*(undefined1 (*) [16])(ray + 0x90));
                        auVar71 = vpcmpeqd_avx(auVar71,_DAT_01f45a50);
                        auVar60 = auVar129 & ~auVar71;
                        if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar60[0xf] < '\0') {
                          uVar27 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                          auVar71 = vandnps_avx(auVar71,auVar129);
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar60 = vandps_avx(local_1918,auVar200);
                            auVar129 = vrcpps_avx(local_1918);
                            auVar160._8_4_ = 0x3f800000;
                            auVar160._0_8_ = 0x3f8000003f800000;
                            auVar160._12_4_ = 0x3f800000;
                            auVar61 = vfnmadd213ps_fma(auVar129,local_1918,auVar160);
                            auVar129 = vfmadd132ps_fma(auVar61,auVar129,auVar129);
                            auVar90._8_4_ = 0x219392ef;
                            auVar90._0_8_ = 0x219392ef219392ef;
                            auVar90._12_4_ = 0x219392ef;
                            auVar60 = vcmpps_avx(auVar60,auVar90,5);
                            auVar60 = vandps_avx(auVar60,auVar129);
                            auVar68._0_4_ = auVar60._0_4_ * (float)local_18f8._0_4_;
                            auVar68._4_4_ = auVar60._4_4_ * (float)local_18f8._4_4_;
                            auVar68._8_4_ = auVar60._8_4_ * fStack_18f0;
                            auVar68._12_4_ = auVar60._12_4_ * fStack_18ec;
                            auVar61 = vminps_avx(auVar68,auVar160);
                            auVar91._0_4_ = auVar60._0_4_ * (float)local_1908._0_4_;
                            auVar91._4_4_ = auVar60._4_4_ * (float)local_1908._4_4_;
                            auVar91._8_4_ = auVar60._8_4_ * fStack_1900;
                            auVar91._12_4_ = auVar60._12_4_ * fStack_18fc;
                            auVar147 = vminps_avx(auVar91,auVar160);
                            uVar7 = *(undefined4 *)(local_1b98 + lVar34 + 0x2c);
                            auVar111._4_4_ = uVar7;
                            auVar111._0_4_ = uVar7;
                            auVar111._8_4_ = uVar7;
                            auVar111._12_4_ = uVar7;
                            auVar129 = vpsrld_avx(auVar111,0x10);
                            auVar173 = ZEXT816(0) << 0x20;
                            auVar60 = vpblendw_avx(auVar111,auVar173,0xaa);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar129 = vcvtdq2ps_avx(auVar129);
                            uVar7 = *(undefined4 *)(local_1b98 + lVar34 + 0x30);
                            auVar144._4_4_ = uVar7;
                            auVar144._0_4_ = uVar7;
                            auVar144._8_4_ = uVar7;
                            auVar144._12_4_ = uVar7;
                            auVar198 = vsubps_avx(auVar160,auVar61);
                            auVar198 = vsubps_avx(auVar198,auVar147);
                            auVar112._0_4_ = auVar198._0_4_ * auVar60._0_4_ * 0.00012207031;
                            auVar112._4_4_ = auVar198._4_4_ * auVar60._4_4_ * 0.00012207031;
                            auVar112._8_4_ = auVar198._8_4_ * auVar60._8_4_ * 0.00012207031;
                            auVar112._12_4_ = auVar198._12_4_ * auVar60._12_4_ * 0.00012207031;
                            auVar130._0_4_ = auVar198._0_4_ * auVar129._0_4_ * 0.00012207031;
                            auVar130._4_4_ = auVar198._4_4_ * auVar129._4_4_ * 0.00012207031;
                            auVar130._8_4_ = auVar198._8_4_ * auVar129._8_4_ * 0.00012207031;
                            auVar130._12_4_ = auVar198._12_4_ * auVar129._12_4_ * 0.00012207031;
                            auVar60 = vpblendw_avx(auVar144,auVar173,0xaa);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar161._0_4_ = auVar60._0_4_ * 0.00012207031;
                            auVar161._4_4_ = auVar60._4_4_ * 0.00012207031;
                            auVar161._8_4_ = auVar60._8_4_ * 0.00012207031;
                            auVar161._12_4_ = auVar60._12_4_ * 0.00012207031;
                            auVar129 = vfmadd231ps_fma(auVar112,auVar147,auVar161);
                            auVar60 = vpsrld_avx(auVar144,0x10);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar145._0_4_ = auVar60._0_4_ * 0.00012207031;
                            auVar145._4_4_ = auVar60._4_4_ * 0.00012207031;
                            auVar145._8_4_ = auVar60._8_4_ * 0.00012207031;
                            auVar145._12_4_ = auVar60._12_4_ * 0.00012207031;
                            auVar147 = vfmadd231ps_fma(auVar130,auVar147,auVar145);
                            uVar7 = *(undefined4 *)(local_1c20 + lVar34);
                            auVar92._4_4_ = uVar7;
                            auVar92._0_4_ = uVar7;
                            auVar92._8_4_ = uVar7;
                            auVar92._12_4_ = uVar7;
                            auVar60 = vpblendw_avx(auVar92,auVar173,0xaa);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar146._0_4_ = auVar60._0_4_ * 0.00012207031;
                            auVar146._4_4_ = auVar60._4_4_ * 0.00012207031;
                            auVar146._8_4_ = auVar60._8_4_ * 0.00012207031;
                            auVar146._12_4_ = auVar60._12_4_ * 0.00012207031;
                            local_1a28 = vfmadd231ps_fma(auVar129,auVar61,auVar146);
                            auVar60 = vpsrld_avx(auVar92,0x10);
                            auVar60 = vcvtdq2ps_avx(auVar60);
                            auVar93._0_4_ = auVar60._0_4_ * 0.00012207031;
                            auVar93._4_4_ = auVar60._4_4_ * 0.00012207031;
                            auVar93._8_4_ = auVar60._8_4_ * 0.00012207031;
                            auVar93._12_4_ = auVar60._12_4_ * 0.00012207031;
                            local_1a38 = vfmadd231ps_fma(auVar147,auVar61,auVar93);
                            local_1a78._0_8_ = local_1938._0_8_;
                            local_1a78._8_8_ = local_1938._8_8_;
                            local_1a78._16_8_ = local_1948._0_8_;
                            local_1a78._24_8_ = local_1948._8_8_;
                            local_1a78._32_8_ = local_1958._0_8_;
                            local_1a78._40_8_ = local_1958._8_8_;
                            local_1a48 = local_1928._0_8_;
                            uStack_1a40 = local_1928._8_8_;
                            args.valid = (int *)&Ng;
                            args.geometryUserPtr = &t;
                            args.context = (RTCRayQueryContext *)&v;
                            args.ray = (RTCRayN *)&u;
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                            ::
                            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                 *)&local_1a78.field_0);
                            local_1a18._4_4_ = uVar16;
                            local_1a18._0_4_ = uVar16;
                            local_1a18._8_4_ = uVar16;
                            local_1a18._12_4_ = uVar16;
                            local_1a78._0_8_ = Ng.field_0._0_8_;
                            local_1a78._8_8_ = Ng.field_0._8_8_;
                            local_1a78._16_8_ = Ng.field_0._16_8_;
                            local_1a78._24_8_ = Ng.field_0._24_8_;
                            local_1a78._32_8_ = Ng.field_0._32_8_;
                            local_1a78._40_8_ = Ng.field_0._40_8_;
                            local_1a48 = u.field_0._0_8_;
                            uStack_1a40 = u.field_0._8_8_;
                            local_1a28._4_4_ = uVar27;
                            local_1a28._0_4_ = uVar27;
                            local_1a28._8_4_ = uVar27;
                            local_1a28._12_4_ = uVar27;
                            vpcmpeqd_avx2(ZEXT1632(local_1a18),ZEXT1632(local_1a18));
                            uStack_1a04 = context->user->instID[0];
                            local_1a08 = uStack_1a04;
                            uStack_1a00 = uStack_1a04;
                            uStack_19fc = uStack_1a04;
                            uStack_19f8 = context->user->instPrimID[0];
                            uStack_19f4 = uStack_19f8;
                            uStack_19f0 = uStack_19f8;
                            uStack_19ec = uStack_19f8;
                            auVar60 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar129 = vblendvps_avx(auVar60,(undefined1  [16])t.field_0,auVar71);
                            *(undefined1 (*) [16])(ray + 0x80) = auVar129;
                            args.valid = (int *)local_1bb8;
                            args.geometryUserPtr = pGVar10->userPtr;
                            args.context = context->user;
                            args.hit = (RTCHitN *)&local_1a78;
                            args.N = 4;
                            args.ray = (RTCRayN *)ray;
                            local_1bb8 = auVar71;
                            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar210._0_8_ = (*pGVar10->occlusionFilterN)(&args);
                              auVar210._8_56_ = extraout_var_01;
                              auVar129 = auVar210._0_16_;
                            }
                            if (local_1bb8 == (undefined1  [16])0x0) {
                              auVar71 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                              auVar71 = auVar71 ^ _DAT_01f46b70;
                              auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                            }
                            else {
                              p_Var11 = context->args->filter;
                              if (p_Var11 == (RTCFilterFunctionN)0x0) {
                                auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                              else {
                                auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                                  auVar70._0_8_ = (*p_Var11)(&args);
                                  auVar70._8_56_ = extraout_var_02;
                                  auVar129 = auVar70._0_16_;
                                  auVar214 = ZEXT1664(CONCAT412(0x7f800000,
                                                                CONCAT48(0x7f800000,
                                                                         0x7f8000007f800000)));
                                }
                              }
                              auVar61 = vpcmpeqd_avx(local_1bb8,_DAT_01f45a50);
                              auVar71 = vpcmpeqd_avx(auVar129,auVar129);
                              auVar71 = auVar61 ^ auVar71;
                              auVar114._8_4_ = 0xff800000;
                              auVar114._0_8_ = 0xff800000ff800000;
                              auVar114._12_4_ = 0xff800000;
                              auVar129 = vblendvps_avx(auVar114,*(undefined1 (*) [16])
                                                                 (args.ray + 0x80),auVar61);
                              *(undefined1 (*) [16])(args.ray + 0x80) = auVar129;
                            }
                            auVar129 = vpslld_avx(auVar71,0x1f);
                            auVar71 = vpsrad_avx(auVar129,0x1f);
                            auVar60 = vblendvps_avx(auVar60,*(undefined1 (*) [16])local_1ba0,
                                                    auVar129);
                            *(undefined1 (*) [16])local_1ba0 = auVar60;
                          }
                          auVar98 = vandnps_avx(auVar71,auVar98);
                        }
                        auVar96 = ZEXT1664(auVar98);
                        lVar34 = lVar34 + 4;
                      } while ((((auVar98 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                || (auVar98 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar98 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || auVar98[0xf] < '\0');
                      local_1b98 = local_1b98 + lVar36;
                      local_1b60 = local_1b60 + lVar36;
                      local_1b68 = local_1b68 + lVar36;
                      local_1b70 = local_1b70 + lVar36;
                      local_1b80 = local_1b80 + lVar36;
                      local_1b88 = local_1b88 + lVar36;
                      local_1b78 = local_1b78 + lVar36;
                      local_1c20 = local_1c20 + lVar36;
                      pGVar41 = pGVar41 + lVar36;
                      local_1b08 = local_1b08 + lVar36;
                      pGVar47 = pGVar47 + lVar36;
                      local_1b00 = local_1b00 + lVar36;
                      local_1b10 = local_1b10 + lVar36;
                      pGVar43 = pGVar43 + lVar36;
                    }
                    local_1968 = auVar94._0_4_;
                    uStack_1964 = auVar94._4_4_;
                    uStack_1960 = auVar94._8_4_;
                    uStack_195c = auVar94._12_4_;
                    local_1988 = auVar116._0_4_;
                    uStack_1984 = auVar116._4_4_;
                    uStack_1980 = auVar116._8_4_;
                    uStack_197c = auVar116._12_4_;
                    auVar94._0_4_ = local_1968 ^ local_1988;
                    auVar94._4_4_ = uStack_1964 ^ uStack_1984;
                    auVar94._8_4_ = uStack_1960 ^ uStack_1980;
                    auVar94._12_4_ = uStack_195c ^ uStack_197c;
                    auVar116 = vpor_avx(auVar96._0_16_,auVar116 ^ auVar72);
                    auVar69 = vpand_avx(auVar116,auVar69);
                  }
                  auVar116 = vpcmpeqd_avx(auVar94,auVar94);
                  auVar69 = auVar69 ^ auVar116;
                  sVar32 = 0;
                }
                else {
                  pre.super_Precalculations.grid = *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                  sVar32 = *(size_t *)pre.super_Precalculations.grid;
                  auVar69._8_8_ = uVar24;
                  auVar69._0_8_ = uVar23;
                  auVar116 = vpcmpeqd_avx(auVar96._0_16_,auVar96._0_16_);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx(auVar69,(undefined1  [16])terminated.field_0);
                auVar116 = auVar116 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar116 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar116 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar116 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar116[0xf]) goto LAB_0155b21c;
                auVar96 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                auVar115._8_4_ = 0xff800000;
                auVar115._0_8_ = 0xff800000ff800000;
                auVar115._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar115,
                                   (undefined1  [16])terminated.field_0);
                if (sVar32 != 0) {
                  local_1ba8->ptr = sVar32;
                  local_1ba8 = local_1ba8 + 1;
                  paVar39->i[0] = -0x800000;
                  paVar39->i[1] = -0x800000;
                  paVar39->i[2] = -0x800000;
                  paVar39->i[3] = -0x800000;
                  paVar39 = paVar39 + 1;
                }
              }
              goto LAB_015595d8;
            }
            uVar29 = root.ptr & 0xfffffffffffffff0;
            auVar116 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar210._0_16_,6);
            root.ptr = 8;
            auVar72 = auVar214._0_16_;
            for (; (auVar210 = ZEXT1664(auVar72), lVar36 != 0 &&
                   (sVar32 = *(size_t *)(uVar29 + 0x20 + lVar36 * 2), sVar32 != 8));
                lVar36 = lVar36 + 4) {
              uVar27 = *(undefined4 *)(uVar29 + 0x90 + lVar36);
              auVar117._4_4_ = uVar27;
              auVar117._0_4_ = uVar27;
              auVar117._8_4_ = uVar27;
              auVar117._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar29 + 0x30 + lVar36);
              auVar97._4_4_ = uVar27;
              auVar97._0_4_ = uVar27;
              auVar97._8_4_ = uVar27;
              auVar97._12_4_ = uVar27;
              auVar71 = *(undefined1 (*) [16])(ray + 0x70);
              auVar60 = vfmadd231ps_fma(auVar97,auVar71,auVar117);
              uVar27 = *(undefined4 *)(uVar29 + 0xb0 + lVar36);
              auVar131._4_4_ = uVar27;
              auVar131._0_4_ = uVar27;
              auVar131._8_4_ = uVar27;
              auVar131._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar29 + 0x50 + lVar36);
              auVar118._4_4_ = uVar27;
              auVar118._0_4_ = uVar27;
              auVar118._8_4_ = uVar27;
              auVar118._12_4_ = uVar27;
              auVar129 = vfmadd231ps_fma(auVar118,auVar71,auVar131);
              uVar27 = *(undefined4 *)(uVar29 + 0xd0 + lVar36);
              auVar148._4_4_ = uVar27;
              auVar148._0_4_ = uVar27;
              auVar148._8_4_ = uVar27;
              auVar148._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar29 + 0x70 + lVar36);
              auVar132._4_4_ = uVar27;
              auVar132._0_4_ = uVar27;
              auVar132._8_4_ = uVar27;
              auVar132._12_4_ = uVar27;
              auVar61 = vfmadd231ps_fma(auVar132,auVar71,auVar148);
              uVar27 = *(undefined4 *)(uVar29 + 0xa0 + lVar36);
              auVar162._4_4_ = uVar27;
              auVar162._0_4_ = uVar27;
              auVar162._8_4_ = uVar27;
              auVar162._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar29 + 0x40 + lVar36);
              auVar149._4_4_ = uVar27;
              auVar149._0_4_ = uVar27;
              auVar149._8_4_ = uVar27;
              auVar149._12_4_ = uVar27;
              auVar147 = vfmadd231ps_fma(auVar149,auVar71,auVar162);
              uVar27 = *(undefined4 *)(uVar29 + 0xc0 + lVar36);
              auVar163._4_4_ = uVar27;
              auVar163._0_4_ = uVar27;
              auVar163._8_4_ = uVar27;
              auVar163._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar29 + 0x60 + lVar36);
              auVar174._4_4_ = uVar27;
              auVar174._0_4_ = uVar27;
              auVar174._8_4_ = uVar27;
              auVar174._12_4_ = uVar27;
              auVar98 = vfmadd231ps_fma(auVar174,auVar71,auVar163);
              uVar27 = *(undefined4 *)(uVar29 + 0xe0 + lVar36);
              auVar164._4_4_ = uVar27;
              auVar164._0_4_ = uVar27;
              auVar164._8_4_ = uVar27;
              auVar164._12_4_ = uVar27;
              uVar27 = *(undefined4 *)(uVar29 + 0x80 + lVar36);
              auVar182._4_4_ = uVar27;
              auVar182._0_4_ = uVar27;
              auVar182._8_4_ = uVar27;
              auVar182._12_4_ = uVar27;
              auVar198 = vfmadd231ps_fma(auVar182,auVar71,auVar164);
              auVar14._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar14._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar14._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar14._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar173 = vfmsub213ps_fma(auVar60,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.x.field_0,auVar14);
              auVar60._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar60._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar60._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar60._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar97 = vfmsub213ps_fma(auVar129,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.y.field_0,auVar60);
              auVar15._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar15._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar15._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar15._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar117 = vfmsub213ps_fma(auVar61,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.z.field_0,auVar15);
              auVar61 = vfmsub213ps_fma(auVar147,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.x.field_0,auVar14);
              auVar147 = vfmsub213ps_fma(auVar98,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.y.field_0,auVar60);
              auVar98 = vfmsub213ps_fma(auVar198,(undefined1  [16])
                                                 tray.rdir.field_0.field_0.z.field_0,auVar15);
              auVar60 = vpminsd_avx(auVar173,auVar61);
              auVar129 = vpminsd_avx(auVar97,auVar147);
              auVar60 = vpmaxsd_avx(auVar60,auVar129);
              auVar129 = vpminsd_avx(auVar117,auVar98);
              auVar60 = vpmaxsd_avx(auVar60,auVar129);
              auVar129 = vpmaxsd_avx(auVar173,auVar61);
              auVar61 = vpmaxsd_avx(auVar97,auVar147);
              auVar147 = vpminsd_avx(auVar129,auVar61);
              auVar129 = vpmaxsd_avx(auVar117,auVar98);
              auVar61 = vpmaxsd_avx(auVar60,(undefined1  [16])tray.tnear.field_0);
              auVar129 = vpminsd_avx(auVar147,auVar129);
              auVar129 = vpminsd_avx(auVar129,(undefined1  [16])tray.tfar.field_0);
              if ((uVar26 & 7) == 6) {
                auVar129 = vcmpps_avx(auVar61,auVar129,2);
                uVar27 = *(undefined4 *)(uVar29 + 0xf0 + lVar36);
                auVar119._4_4_ = uVar27;
                auVar119._0_4_ = uVar27;
                auVar119._8_4_ = uVar27;
                auVar119._12_4_ = uVar27;
                auVar61 = vcmpps_avx(auVar119,auVar71,2);
                uVar27 = *(undefined4 *)(uVar29 + 0x100 + lVar36);
                auVar133._4_4_ = uVar27;
                auVar133._0_4_ = uVar27;
                auVar133._8_4_ = uVar27;
                auVar133._12_4_ = uVar27;
                auVar71 = vcmpps_avx(auVar71,auVar133,1);
                auVar71 = vandps_avx(auVar61,auVar71);
                auVar71 = vandps_avx(auVar71,auVar129);
              }
              else {
                auVar71 = vcmpps_avx(auVar61,auVar129,2);
              }
              auVar71 = vandps_avx(auVar71,auVar116);
              auVar71 = vpslld_avx(auVar71,0x1f);
              if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar71[0xf]) {
                auVar96 = ZEXT1664(auVar72);
                sVar32 = root.ptr;
              }
              else {
                auVar71 = vblendvps_avx(auVar214._0_16_,auVar60,auVar71);
                auVar96 = ZEXT1664(auVar71);
                if (root.ptr != 8) {
                  local_1ba8->ptr = root.ptr;
                  local_1ba8 = local_1ba8 + 1;
                  *(undefined1 (*) [16])paVar39->v = auVar72;
                  paVar39 = paVar39 + 1;
                }
              }
              auVar72 = auVar96._0_16_;
              root.ptr = sVar32;
            }
            if (root.ptr == 8) goto LAB_0155983f;
            auVar116 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar72,6);
            uVar27 = vmovmskps_avx(auVar116);
          } while ((byte)uVar35 < (byte)POPCOUNT(uVar27));
          local_1ba8->ptr = root.ptr;
          local_1ba8 = local_1ba8 + 1;
          *(undefined1 (*) [16])paVar39->v = auVar72;
          paVar39 = paVar39 + 1;
LAB_0155983f:
          iVar28 = 4;
        }
        else {
          while (uVar29 != 0) {
            sVar32 = 0;
            for (uVar33 = uVar29; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              sVar32 = sVar32 + 1;
            }
            uVar29 = uVar29 - 1 & uVar29;
            auVar96 = ZEXT1664(auVar96._0_16_);
            bVar25 = occluded1(This,bvh,root,sVar32,&pre,ray,&tray,context);
            if (bVar25) {
              terminated.field_0.i[sVar32] = -1;
            }
          }
          auVar116 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar28 = 3;
          auVar214 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar116 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar116 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar116 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar116[0xf] < '\0') {
            auVar96 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar116._8_4_ = 0xff800000;
            auVar116._0_8_ = 0xff800000ff800000;
            auVar116._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar116,
                               (undefined1  [16])terminated.field_0);
            iVar28 = 2;
          }
          auVar210 = ZEXT1664((undefined1  [16])vVar8.field_0);
          if (uVar35 < uVar26) goto LAB_0155961c;
        }
      } while ((iVar28 == 4) || (iVar28 == 2));
LAB_0155b21c:
      auVar12 = vandps_avx(auVar12,(undefined1  [16])terminated.field_0);
      auVar95._8_4_ = 0xff800000;
      auVar95._0_8_ = 0xff800000ff800000;
      auVar95._12_4_ = 0xff800000;
      auVar12 = vmaskmovps_avx(auVar12,auVar95);
      *(undefined1 (*) [16])local_1ba0 = auVar12;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }